

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O0

void __thiscall
FNodeBuilder::AddMinisegs(FNodeBuilder *this,node_t *node,DWORD splitseg,DWORD *fset,DWORD *bset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sector_t_conflict *psVar4;
  sector_t_conflict *psVar5;
  DWORD seg1;
  DWORD seg1_00;
  DWORD DVar6;
  DWORD partner;
  DWORD DVar7;
  FPrivSeg *pFVar8;
  FPrivVert *pFVar9;
  sector_t_conflict *bsector;
  sector_t_conflict *fsector;
  DWORD bnseg;
  DWORD fnseg;
  DWORD bseg2;
  DWORD fseg2;
  DWORD bseg1;
  DWORD fseg1;
  FEvent *prev;
  FEvent *event;
  DWORD *bset_local;
  DWORD *fset_local;
  DWORD splitseg_local;
  node_t *node_local;
  FNodeBuilder *this_local;
  
  prev = FEventTree::GetMinimum(&this->Events);
  _bseg1 = (FEvent *)0x0;
  for (; prev != (FEvent *)0x0; prev = FEventTree::GetSuccessor(&this->Events,prev)) {
    if ((((_bseg1 != (FEvent *)0x0) &&
         (seg1 = CheckLoopStart(this,node->dx,node->dy,(_bseg1->Info).Vertex,(prev->Info).Vertex),
         seg1 != 0xffffffff)) &&
        (seg1_00 = CheckLoopStart(this,-node->dx,-node->dy,(prev->Info).Vertex,(_bseg1->Info).Vertex
                                 ), seg1_00 != 0xffffffff)) &&
       ((DVar6 = CheckLoopEnd(this,node->dx,node->dy,(prev->Info).Vertex), DVar6 != 0xffffffff &&
        (DVar6 = CheckLoopEnd(this,-node->dx,-node->dy,(_bseg1->Info).Vertex), DVar6 != 0xffffffff))
       )) {
      partner = AddMiniseg(this,(_bseg1->Info).Vertex,(prev->Info).Vertex,0xffffffff,seg1,splitseg);
      DVar6 = *fset;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)partner);
      pFVar8->next = DVar6;
      *fset = partner;
      DVar7 = AddMiniseg(this,(prev->Info).Vertex,(_bseg1->Info).Vertex,partner,seg1_00,splitseg);
      DVar6 = *bset;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)DVar7);
      pFVar8->next = DVar6;
      *bset = DVar7;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)seg1);
      psVar4 = pFVar8->frontsector;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)seg1_00);
      psVar5 = pFVar8->frontsector;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)partner);
      pFVar8->frontsector = psVar4;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)partner);
      pFVar8->backsector = psVar5;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)DVar7);
      pFVar8->frontsector = psVar5;
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)DVar7);
      pFVar8->backsector = psVar4;
      if ((psVar4 != psVar5) &&
         ((pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                              (&this->Segs,(ulong)seg1), psVar4 != pFVar8->backsector &&
          (pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                              (&this->Segs,(ulong)seg1_00), psVar5 != pFVar8->backsector)))) {
        pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)seg1);
        psVar4 = pFVar8->frontsector;
        pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)(_bseg1->Info).Vertex);
        iVar1 = (pFVar9->super_FSimpleVert).x;
        pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)(_bseg1->Info).Vertex);
        iVar2 = (pFVar9->super_FSimpleVert).y;
        pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)seg1_00);
        psVar5 = pFVar8->frontsector;
        pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)(prev->Info).Vertex);
        iVar3 = (pFVar9->super_FSimpleVert).x;
        pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)(prev->Info).Vertex);
        Warn("Sectors %d at (%d,%d) and %d at (%d,%d) don\'t match.\n",psVar4,
             (ulong)(uint)(iVar1 >> 0x10),(ulong)(uint)(iVar2 >> 0x10),psVar5,
             (ulong)(uint)(iVar3 >> 0x10),(pFVar9->super_FSimpleVert).y >> 0x10);
      }
    }
    _bseg1 = prev;
  }
  return;
}

Assistant:

void FNodeBuilder::AddMinisegs (const node_t &node, DWORD splitseg, DWORD &fset, DWORD &bset)
{
	FEvent *event = Events.GetMinimum (), *prev = NULL;

	while (event != NULL)
	{
		if (prev != NULL)
		{
			DWORD fseg1, bseg1, fseg2, bseg2;
			DWORD fnseg, bnseg;

			// Minisegs should only be added when they can create valid loops on both the front and
			// back of the splitter. This means some subsectors could be unclosed if their sectors
			// are unclosed, but at least we won't be needlessly creating subsectors in void space.
			// Unclosed subsectors can be closed trivially once the BSP tree is complete.

			if ((fseg1 = CheckLoopStart (node.dx, node.dy, prev->Info.Vertex, event->Info.Vertex)) != DWORD_MAX &&
				(bseg1 = CheckLoopStart (-node.dx, -node.dy, event->Info.Vertex, prev->Info.Vertex)) != DWORD_MAX &&
				(fseg2 = CheckLoopEnd (node.dx, node.dy, event->Info.Vertex)) != DWORD_MAX &&
				(bseg2 = CheckLoopEnd (-node.dx, -node.dy, prev->Info.Vertex)) != DWORD_MAX)
			{
				// Add miniseg on the front side
				fnseg = AddMiniseg (prev->Info.Vertex, event->Info.Vertex, DWORD_MAX, fseg1, splitseg);
				Segs[fnseg].next = fset;
				fset = fnseg;

				// Add miniseg on the back side
				bnseg = AddMiniseg (event->Info.Vertex, prev->Info.Vertex, fnseg, bseg1, splitseg);
				Segs[bnseg].next = bset;
				bset = bnseg;

				sector_t *fsector, *bsector;

				fsector = Segs[fseg1].frontsector;
				bsector = Segs[bseg1].frontsector;

				Segs[fnseg].frontsector = fsector;
				Segs[fnseg].backsector = bsector;
				Segs[bnseg].frontsector = bsector;
				Segs[bnseg].backsector = fsector;

				// Only print the warning if this might be bad.
				if (fsector != bsector &&
					fsector != Segs[fseg1].backsector &&
					bsector != Segs[bseg1].backsector)
				{
					Warn ("Sectors %d at (%d,%d) and %d at (%d,%d) don't match.\n",
						Segs[fseg1].frontsector,
						Vertices[prev->Info.Vertex].x>>FRACBITS, Vertices[prev->Info.Vertex].y>>FRACBITS,
						Segs[bseg1].frontsector,
						Vertices[event->Info.Vertex].x>>FRACBITS, Vertices[event->Info.Vertex].y>>FRACBITS
						);
				}

				D(Printf (PRINT_LOG, "**Minisegs** %d/%d added %d(%d,%d)->%d(%d,%d)\n", fnseg, bnseg,
					prev->Info.Vertex,
					Vertices[prev->Info.Vertex].x>>16, Vertices[prev->Info.Vertex].y>>16,
					event->Info.Vertex,
					Vertices[event->Info.Vertex].x>>16, Vertices[event->Info.Vertex].y>>16));
			}
		}
		prev = event;
		event = Events.GetSuccessor (event);
	}
}